

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

BOOL SHMInitialize(void)

{
  bool bVar1;
  BOOL BVar2;
  void *pvVar3;
  int *piVar4;
  undefined1 *local_38;
  uint local_2c;
  SHMPTR SStack_28;
  SHM_POOL_SIZES sps;
  SHMPTR pool_end;
  SHMPTR pool_start;
  SHM_FIRST_HEADER *header;
  int size;
  
  CCLock::Reset(&shm_critsec,false);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pvVar3 = mmap64((void *)0x0,0x40000,3,0x22,-1,0);
  Volatile<void_*>::operator=(shm_segment_bases,pvVar3);
  local_38 = &DAT_ffffffffffffffff;
  bVar1 = Volatile<void*>::operator==((Volatile<void*> *)shm_segment_bases,&local_38);
  if (bVar1) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar4 = __errno_location();
    strerror(*piVar4);
    header._4_4_ = 0;
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    Volatile<void_*>::Load(shm_segment_bases);
    pool_start = (SHMPTR)Volatile<void_*>::Load(shm_segment_bases);
    piVar4 = Volatile<int>::operator&((Volatile<int> *)(pool_start + 0x40));
    InterlockedExchange(piVar4,0);
    memset((void *)(pool_start + 0xa8),0,0x18);
    pool_end = 0xc0;
    header._0_4_ = 0xffd0;
    for (local_2c = 0; (int)local_2c < 4; local_2c = local_2c + 1) {
      SStack_28 = SHMInitPool(pool_end,block_sizes[local_2c],(int)header,
                              (SHM_POOL_INFO *)(pool_start + 0x48 + (ulong)local_2c * 0x18));
      if (SStack_28 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
          pvVar3 = Volatile::operator_cast_to_void_((Volatile *)shm_segment_bases);
          munmap(pvVar3,0x40000);
          return 0;
        }
        abort();
      }
      Volatile<unsigned_long>::operator=
                ((Volatile<unsigned_long> *)(pool_start + (ulong)local_2c * 8),pool_end);
      Volatile<unsigned_long>::operator=
                ((Volatile<unsigned_long> *)(pool_start + 0x20 + (ulong)local_2c * 8),SStack_28);
      pool_end = (long)(int)header + pool_end;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    shm_numsegments = 1;
    Volatile<int>::operator=(&lock_count,0);
    Volatile<void_*>::operator=(&locking_thread,(void *)0x0);
    BVar2 = SHMMapUnknownSegments();
    if (BVar2 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SHMCleanup();
      header._4_4_ = 0;
    }
    else {
      header._4_4_ = 1;
    }
  }
  return header._4_4_;
}

Assistant:

BOOL SHMInitialize(void)
{
    shm_critsec.Reset();

    init_waste();

        int size;
        SHM_FIRST_HEADER *header;
        SHMPTR pool_start;
        SHMPTR pool_end;
        enum SHM_POOL_SIZES sps;

        TRACE("Now initializing global shared memory system\n");

        // Not really shared in CoreCLR; we don't try to talk to other CoreCLRs.
        shm_segment_bases[0] = mmap(NULL, segment_size,PROT_READ|PROT_WRITE,
                                    MAP_ANON|MAP_PRIVATE, -1, 0);
        if(shm_segment_bases[0] == MAP_FAILED)
        {
            ERROR("mmap() failed; error is %d (%s)\n", errno, strerror(errno));
            return FALSE;
        }
        TRACE("Mapped first SHM segment at %p\n",shm_segment_bases[0].Load());

        /* Initialize first segment's header */
        header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

        InterlockedExchange((LONG *)&header->spinlock, 0);

#ifdef TRACK_SHMLOCK_OWNERSHIP
        header->dwHeadCanaries[0] = HeadSignature;
        header->dwHeadCanaries[1] = HeadSignature;
        header->dwTailCanaries[0] = TailSignature;
        header->dwTailCanaries[1] = TailSignature;

        // Check spinlock size
        _ASSERTE(sizeof(DWORD) == sizeof(header->spinlock));
        // Check spinlock alignment
        _ASSERTE(0 == ((DWORD_PTR)&header->spinlock % (DWORD_PTR)sizeof(void *)));
#endif // TRACK_SHMLOCK_OWNERSHIP

#ifdef TRACK_SHMLOCK_OWNERSHIP
        header->pidtidCurrentOwner.pid = 0;
        header->pidtidCurrentOwner.tid = 0;
        memset((void *)header->pidtidOwners, 0, sizeof(header->pidtidOwners));
        header->ulOwnersIdx = 0;
#endif // TRACK_SHMLOCK_OWNERSHIP

        /* SHM information array starts with NULLs */
        memset((void *)header->shm_info, 0, SIID_LAST*sizeof(SHMPTR));

        /* Initialize memory pools */

        /* first pool starts right after header */
        pool_start = roundup(sizeof(SHM_FIRST_HEADER), sizeof(INT64));

        /* Same size for each pool, ensuring alignment is correct */
        size = ((segment_size-pool_start)/SPS_LAST) & ~(sizeof(INT64)-1);

        for (sps = static_cast<SHM_POOL_SIZES>(0); sps < SPS_LAST;
             sps = static_cast<SHM_POOL_SIZES>(sps + 1))
        {
            pool_end = SHMInitPool(pool_start, block_sizes[sps], size,
                                   (SHM_POOL_INFO *)&header->pools[sps]);

            if(pool_end ==0)
            {
                ERROR("SHMInitPool failed.\n");
                munmap(shm_segment_bases[0],segment_size);
                return FALSE;
            }
            /* save first and last element of each pool for this segment */
            header->header.first_pool_blocks[sps] = pool_start;
            header->header.last_pool_blocks[sps] = pool_end;

            /* next pool starts immediately after this one */
            pool_start +=size;
        }

        TRACE("Global shared memory initialization complete.\n");

    shm_numsegments = 1;
    lock_count = 0;
    locking_thread = 0;

    /* hook into all SHM segments */
    if(!SHMMapUnknownSegments())
    {
        ERROR("Error while mapping segments!\n");
        SHMCleanup();
        return FALSE;
    }
    return TRUE;
}